

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O2

wchar_t lzh_decode_huffman(huffman_conflict *hf,uint rbits)

{
  wchar_t wVar1;
  wchar_t wVar2;
  wchar_t wVar4;
  wchar_t wVar5;
  htree_t *phVar3;
  
  wVar4 = hf->shift_bits;
  wVar1 = hf->len_avail;
  wVar2 = (wchar_t)hf->tbl[rbits >> ((byte)wVar4 & 0x1f)];
  if (wVar1 != L'\0' && wVar1 <= (int)(uint)hf->tbl[rbits >> ((byte)wVar4 & 0x1f)]) {
    while (((wVar5 = wVar2 - wVar1, wVar1 <= wVar2 && (wVar2 = L'\0', L'\0' < wVar4)) &&
           (wVar5 < hf->tree_used))) {
      wVar4 = wVar4 + L'\xffffffff';
      phVar3 = (htree_t *)&hf->tree[wVar5].right;
      if ((rbits >> (wVar4 & 0x1fU) & 1) != 0) {
        phVar3 = hf->tree + wVar5;
      }
      wVar2 = (wchar_t)phVar3->left;
    }
  }
  return wVar2;
}

Assistant:

static inline int
lzh_decode_huffman(struct huffman *hf, unsigned rbits)
{
	int c;
	/*
	 * At first search an index table for a bit pattern.
	 * If it fails, search a huffman tree for.
	 */
	c = hf->tbl[rbits >> hf->shift_bits];
	if (c < hf->len_avail || hf->len_avail == 0)
		return (c);
	/* This bit pattern needs to be found out at a huffman tree. */
	return (lzh_decode_huffman_tree(hf, rbits, c));
}